

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplaceRealloc<slang::parsing::Token_const&>
          (SmallVectorBase<slang::parsing::Token> *this,pointer pos,Token *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  Info *pIVar4;
  undefined8 uVar5;
  pointer pTVar6;
  pointer pTVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  pointer pTVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar14 = this->len + 1;
  uVar3 = this->cap;
  if (uVar14 < uVar3 * 2) {
    uVar14 = uVar3 * 2;
  }
  if (0x7ffffffffffffff - uVar3 < uVar3) {
    uVar14 = 0x7ffffffffffffff;
  }
  lVar15 = (long)pos - (long)this->data_;
  pTVar11 = (pointer)operator_new(uVar14 << 4);
  pIVar4 = args->info;
  *(undefined8 *)((long)pTVar11 + lVar15) = *(undefined8 *)args;
  ((undefined8 *)((long)pTVar11 + lVar15))[1] = pIVar4;
  p = this->data_;
  lVar12 = this->len * 0x10;
  lVar13 = (long)p + (lVar12 - (long)pos);
  pTVar6 = p;
  pTVar7 = pTVar11;
  if (lVar13 == 0) {
    if (this->len != 0) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->kind + lVar13);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pTVar11->kind + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar13 = lVar13 + 0x10;
      } while (lVar12 != lVar13);
    }
  }
  else {
    for (; pTVar6 != pos; pTVar6 = pTVar6 + 1) {
      uVar8 = pTVar6->field_0x2;
      NVar9.raw = (pTVar6->numFlags).raw;
      uVar10 = pTVar6->rawLen;
      pIVar4 = pTVar6->info;
      pTVar7->kind = pTVar6->kind;
      pTVar7->field_0x2 = uVar8;
      pTVar7->numFlags = (NumericTokenFlags)NVar9.raw;
      pTVar7->rawLen = uVar10;
      pTVar7->info = pIVar4;
      pTVar7 = pTVar7 + 1;
    }
    memcpy((void *)((long)pTVar11 + lVar15 + 0x10),pos,(lVar13 - 0x10U & 0xfffffffffffffff0) + 0x10)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar14;
  this->data_ = pTVar11;
  return (pointer)((long)pTVar11 + lVar15);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}